

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

string * testing::internal::XmlUnitTestResultPrinter::RemoveInvalidXmlCharacters(string *str)

{
  bool bVar1;
  string *in_RDI;
  const_iterator it;
  string *output;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [3];
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_30[0]._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(local_30);
    in_stack_ffffffffffffffb7 = IsValidXmlCharacter('\0');
    if ((bool)in_stack_ffffffffffffffb7) {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(local_30);
      std::__cxx11::string::push_back((char)in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_30);
  }
  return in_RDI;
}

Assistant:

std::string XmlUnitTestResultPrinter::RemoveInvalidXmlCharacters(
    const std::string& str) {
  std::string output;
  output.reserve(str.size());
  for (std::string::const_iterator it = str.begin(); it != str.end(); ++it)
    if (IsValidXmlCharacter(*it))
      output.push_back(*it);

  return output;
}